

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlComment::operator=(TiXmlComment *this,TiXmlComment *base)

{
  TiXmlNode::Clear(&this->super_TiXmlNode);
  TiXmlNode::CopyTo(&base->super_TiXmlNode,&this->super_TiXmlNode);
  return;
}

Assistant:

void TiXmlComment::operator=(const TiXmlComment& base) {
	Clear();
	base.CopyTo(this);
}